

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall
AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag
          (AutoSetDispatchHaltFlag *this,ScriptContext *scriptContext,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugManager *pDVar4;
  DebugContext *pDVar5;
  ProbeContainer *pPVar6;
  ThreadContext *threadContext_local;
  ScriptContext *scriptContext_local;
  AutoSetDispatchHaltFlag *this_local;
  
  this->m_scriptContext = scriptContext;
  this->m_threadContext = threadContext;
  if (this->m_scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xdb,"(m_scriptContext != nullptr)","m_scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->m_threadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xdc,"(m_threadContext != nullptr)","m_threadContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar4 = ThreadContext::GetDebugManager(this->m_threadContext);
  bVar2 = Js::DebugManager::IsAtDispatchHalt(pDVar4);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xde,"(!m_threadContext->GetDebugManager()->IsAtDispatchHalt())",
                       "!m_threadContext->GetDebugManager()->IsAtDispatchHalt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar4 = ThreadContext::GetDebugManager(this->m_threadContext);
  Js::DebugManager::SetDispatchHalt(pDVar4,true);
  pDVar5 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  pPVar6 = Js::DebugContext::GetProbeContainer(pDVar5);
  bVar2 = Js::ProbeContainer::IsPrimaryBrokenToDebuggerContext(pPVar6);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe1,
                       "(!m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext())"
                       ,
                       "!m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar5 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  pPVar6 = Js::DebugContext::GetProbeContainer(pDVar5);
  Js::ProbeContainer::SetIsPrimaryBrokenToDebuggerContext(pPVar6,true);
  return;
}

Assistant:

AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag(Js::ScriptContext *scriptContext, ThreadContext *threadContext) :
    m_scriptContext(scriptContext),
    m_threadContext(threadContext)
{
    Assert(m_scriptContext != nullptr);
    Assert(m_threadContext != nullptr);

    Assert(!m_threadContext->GetDebugManager()->IsAtDispatchHalt());
    m_threadContext->GetDebugManager()->SetDispatchHalt(true);

    Assert(!m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext());
    m_scriptContext->GetDebugContext()->GetProbeContainer()->SetIsPrimaryBrokenToDebuggerContext(true);
}